

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O2

Fl_Double_Window * make_global_settings_window(void)

{
  Fl_Choice *pFVar1;
  Fl_Boxtype FVar2;
  Fl_Double_Window *this;
  Fl_Group *pFVar3;
  Fl_Widget *pFVar4;
  Fl_Button *pFVar5;
  
  this = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(this,400,0x17a,"FLTK Preferences");
  global_settings_window = this;
  (this->super_Fl_Window).super_Fl_Group.super_Fl_Widget.color_ = 0x32;
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,10,0x17c,100,"Keyboard Focus Options");
  FVar2 = fl_define_FL_GTK_UP_BOX();
  (pFVar3->super_Fl_Widget).box_ = (char)FVar2 + '\x01';
  (pFVar3->super_Fl_Widget).label_.font = 2;
  (pFVar3->super_Fl_Widget).label_.align_ = 0x15;
  pFVar4 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,0xf5,0x28,100,0x19,"Visible Keyboard Focus:");
  wVisibleFocus = (Fl_Choice *)pFVar4;
  Fl_Widget::tooltip(pFVar4,
                     "OPTION_VISIBLE_FOCUS\n\nIf visible focus is switched on, FLTK will draw a dotted rectangle inside the widget that will receive the next keystroke. If switched off, no such indicator will be drawn and keyboard navigation is disabled.\n\nDefault is on."
                    );
  pFVar1 = wVisibleFocus;
  (wVisibleFocus->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar1->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_wVisibleFocus;
  Fl_Menu_::menu(&pFVar1->super_Fl_Menu_,menu_wVisibleFocus);
  pFVar4 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,0xf5,0x4b,100,0x19,"Arrow Keys move Focus:");
  wArrowFocus = (Fl_Choice *)pFVar4;
  Fl_Widget::tooltip(pFVar4,
                     "OPTION_ARROW_FOCUS\n\nWhen switched on, moving the text cursor beyond the start or end of the text in a text widget will change focus to the next widget. When switched off, the cursor will stop at the end of the text. Pressing Tab or Ctrl-Tab will advance the keyboard focus. Switch this on, if you want the old behavior of FLTK 1.1.\n\nDefault is off."
                    );
  pFVar1 = wArrowFocus;
  (wArrowFocus->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar1->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_wArrowFocus;
  Fl_Menu_::menu(&pFVar1->super_Fl_Menu_,menu_wArrowFocus);
  Fl_Group::end(pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x78,0x17c,0x41,"Tooltip Options");
  FVar2 = fl_define_FL_GTK_UP_BOX();
  (pFVar3->super_Fl_Widget).box_ = (char)FVar2 + '\x01';
  (pFVar3->super_Fl_Widget).label_.font = 2;
  (pFVar3->super_Fl_Widget).label_.align_ = 0x15;
  pFVar4 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,0xf5,0x96,100,0x19,"Show Tooltips:");
  wShowTooltips = (Fl_Choice *)pFVar4;
  Fl_Widget::tooltip(pFVar4,
                     "OPTION_SHOW_TOOLTIPS\n\nIf tooltips are enabled, hovering the mouse over a widget with a tooltip text will open a little tooltip window until the mouse leaves the widget. If disabled, no tooltip is shown.\n\nDefault is on."
                    );
  pFVar1 = wShowTooltips;
  (wShowTooltips->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar1->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_wShowTooltips;
  Fl_Menu_::menu(&pFVar1->super_Fl_Menu_,menu_wShowTooltips);
  Fl_Group::end(pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0xc2,0x17c,0x42,"Drag And Drop Options");
  FVar2 = fl_define_FL_GTK_UP_BOX();
  (pFVar3->super_Fl_Widget).box_ = (char)FVar2 + '\x01';
  (pFVar3->super_Fl_Widget).label_.font = 2;
  (pFVar3->super_Fl_Widget).label_.align_ = 0x15;
  pFVar4 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,0xf5,0xe1,100,0x19,"Allow dragging Text:");
  wDNDText = (Fl_Choice *)pFVar4;
  Fl_Widget::tooltip(pFVar4,
                     "OPTION_DND_TEXT\n\nIf text drag-and-drop is enabled, the user can select and drag text from any text widget. If disabled, no dragging is possible, however dropping text from other applications still works.\n\nDefault is on."
                    );
  pFVar1 = wDNDText;
  (wDNDText->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar1->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_wDNDText;
  Fl_Menu_::menu(&pFVar1->super_Fl_Menu_,menu_wDNDText);
  Fl_Group::end(pFVar3);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0x10d,0x17c,0x42,"Native File Chooser Options");
  FVar2 = fl_define_FL_GTK_UP_BOX();
  (pFVar3->super_Fl_Widget).box_ = (char)FVar2 + '\x01';
  (pFVar3->super_Fl_Widget).label_.font = 2;
  (pFVar3->super_Fl_Widget).label_.align_ = 0x15;
  pFVar4 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,0xf5,300,100,0x19,"Native File Chooser uses GTK:");
  wGTKText = (Fl_Choice *)pFVar4;
  Fl_Widget::tooltip(pFVar4,
                     "OPTION_FNFC_USES_GTK\n        \nIf \'Native File Chooser uses GTK\' is enabled, the Fl_Native_File_Chooser class\ncalls the GTK open/save file dialogs when they are available on the platfom. If disabled, the Fl_Native_File_Chooser class\nalways uses FLTK\'s own file dialog (i.e., Fl_File_Chooser) even if GTK is available.\n\nDefault is on."
                    );
  pFVar1 = wGTKText;
  (wGTKText->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar1->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_wGTKText;
  Fl_Menu_::menu(&pFVar1->super_Fl_Menu_,menu_wGTKText);
  Fl_Group::end(pFVar3);
  pFVar4 = (Fl_Widget *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar4,10,0x159,0x8d,0x19,(char *)0x0);
  wUserOrSystem = (Fl_Choice *)pFVar4;
  Fl_Widget::tooltip(pFVar4,
                     "Change settings for the current user, or default values for all users of this computer. Individual users can override system options, if they set their options to specific values (not \'default\')."
                    );
  pFVar1 = wUserOrSystem;
  (wUserOrSystem->super_Fl_Menu_).down_box_ = '\x0e';
  (pFVar1->super_Fl_Menu_).super_Fl_Widget.callback_ = cb_wUserOrSystem;
  Fl_Menu_::menu(&pFVar1->super_Fl_Menu_,menu_wUserOrSystem);
  pFVar5 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar5,0xe6,0x159,0x4b,0x19,"Cancel");
  (pFVar5->super_Fl_Widget).callback_ = cb_Cancel1;
  pFVar5 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar5,0x13b,0x159,0x4b,0x19,"OK");
  (pFVar5->super_Fl_Widget).callback_ = cb_OK;
  Fl_Group::end((Fl_Group *)global_settings_window);
  readPrefs();
  Fl::option(OPTION_SHOW_TOOLTIPS,true);
  return global_settings_window;
}

Assistant:

Fl_Double_Window* make_global_settings_window() {
  { global_settings_window = new Fl_Double_Window(400, 378, "FLTK Preferences");
    global_settings_window->color(FL_LIGHT1);
    { Fl_Group* o = new Fl_Group(10, 10, 380, 100, "Keyboard Focus Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wVisibleFocus = new Fl_Choice(245, 40, 100, 25, "Visible Keyboard Focus:");
        wVisibleFocus->tooltip("OPTION_VISIBLE_FOCUS\n\nIf visible focus is switched on, FLTK will draw a dot\
ted rectangle inside the widget that will receive the next keystroke. If switc\
hed off, no such indicator will be drawn and keyboard navigation is disabled.\
\n\nDefault is on.");
        wVisibleFocus->down_box(FL_BORDER_BOX);
        wVisibleFocus->callback((Fl_Callback*)cb_wVisibleFocus);
        wVisibleFocus->menu(menu_wVisibleFocus);
      } // Fl_Choice* wVisibleFocus
      { wArrowFocus = new Fl_Choice(245, 75, 100, 25, "Arrow Keys move Focus:");
        wArrowFocus->tooltip("OPTION_ARROW_FOCUS\n\nWhen switched on, moving the text cursor beyond the sta\
rt or end of the text in a text widget will change focus to the next widget. W\
hen switched off, the cursor will stop at the end of the text. Pressing Tab or\
 Ctrl-Tab will advance the keyboard focus. Switch this on, if you want the old\
 behavior of FLTK 1.1.\n\nDefault is off.");
        wArrowFocus->down_box(FL_BORDER_BOX);
        wArrowFocus->callback((Fl_Callback*)cb_wArrowFocus);
        wArrowFocus->menu(menu_wArrowFocus);
      } // Fl_Choice* wArrowFocus
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 120, 380, 65, "Tooltip Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wShowTooltips = new Fl_Choice(245, 150, 100, 25, "Show Tooltips:");
        wShowTooltips->tooltip("OPTION_SHOW_TOOLTIPS\n\nIf tooltips are enabled, hovering the mouse over a wi\
dget with a tooltip text will open a little tooltip window until the mouse lea\
ves the widget. If disabled, no tooltip is shown.\n\nDefault is on.");
        wShowTooltips->down_box(FL_BORDER_BOX);
        wShowTooltips->callback((Fl_Callback*)cb_wShowTooltips);
        wShowTooltips->menu(menu_wShowTooltips);
      } // Fl_Choice* wShowTooltips
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 194, 380, 66, "Drag And Drop Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wDNDText = new Fl_Choice(245, 225, 100, 25, "Allow dragging Text:");
        wDNDText->tooltip("OPTION_DND_TEXT\n\nIf text drag-and-drop is enabled, the user can select and \
drag text from any text widget. If disabled, no dragging is possible, however \
dropping text from other applications still works.\n\nDefault is on.");
        wDNDText->down_box(FL_BORDER_BOX);
        wDNDText->callback((Fl_Callback*)cb_wDNDText);
        wDNDText->menu(menu_wDNDText);
      } // Fl_Choice* wDNDText
      o->end();
    } // Fl_Group* o
    { Fl_Group* o = new Fl_Group(10, 269, 380, 66, "Native File Chooser Options");
      o->box(FL_GTK_DOWN_BOX);
      o->labelfont(2);
      o->align(Fl_Align(FL_ALIGN_TOP_LEFT|FL_ALIGN_INSIDE));
      { wGTKText = new Fl_Choice(245, 300, 100, 25, "Native File Chooser uses GTK:");
        wGTKText->tooltip("OPTION_FNFC_USES_GTK\n        \nIf \'Native File Chooser uses GTK\' is enable\
d, the Fl_Native_File_Chooser class\ncalls the GTK open/save file dialogs when\
 they are available on the platfom. If disabled, the Fl_Native_File_Chooser cl\
ass\nalways uses FLTK\'s own file dialog (i.e., Fl_File_Chooser) even if GTK i\
s available.\n\nDefault is on.");
        wGTKText->down_box(FL_BORDER_BOX);
        wGTKText->callback((Fl_Callback*)cb_wGTKText);
        wGTKText->menu(menu_wGTKText);
      } // Fl_Choice* wGTKText
      o->end();
    } // Fl_Group* o
    { wUserOrSystem = new Fl_Choice(10, 345, 141, 25);
      wUserOrSystem->tooltip("Change settings for the current user, or default values for all users of this\
 computer. Individual users can override system options, if they set their opt\
ions to specific values (not \'default\').");
      wUserOrSystem->down_box(FL_BORDER_BOX);
      wUserOrSystem->callback((Fl_Callback*)cb_wUserOrSystem);
      wUserOrSystem->menu(menu_wUserOrSystem);
    } // Fl_Choice* wUserOrSystem
    { Fl_Button* o = new Fl_Button(230, 345, 75, 25, "Cancel");
      o->callback((Fl_Callback*)cb_Cancel1);
    } // Fl_Button* o
    { Fl_Button* o = new Fl_Button(315, 345, 75, 25, "OK");
      o->callback((Fl_Callback*)cb_OK);
    } // Fl_Button* o
    global_settings_window->end();
  } // Fl_Double_Window* global_settings_window
  readPrefs();
    Fl::option(Fl::OPTION_SHOW_TOOLTIPS,1); // make sure tooltips are on !
  return global_settings_window;
}